

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlACatalogResolveURI(xmlCatalogPtr catal,xmlChar *URI)

{
  xmlChar *cur;
  xmlChar *sgml;
  xmlChar *ret;
  xmlChar *URI_local;
  xmlCatalogPtr catal_local;
  
  sgml = (xmlChar *)0x0;
  if ((URI == (xmlChar *)0x0) || (catal == (xmlCatalogPtr)0x0)) {
    catal_local = (xmlCatalogPtr)0x0;
  }
  else {
    if (xmlDebugCatalogs != 0) {
      xmlCatalogPrintDebug("Resolve URI %s\n",URI);
    }
    if (catal->type == XML_XML_CATALOG_TYPE) {
      sgml = xmlCatalogListXMLResolveURI(catal->xml,URI);
      if (sgml == (xmlChar *)0xffffffffffffffff) {
        sgml = (xmlChar *)0x0;
      }
    }
    else {
      cur = xmlCatalogSGMLResolve(catal,(xmlChar *)0x0,URI);
      if (cur != (xmlChar *)0x0) {
        sgml = xmlStrdup(cur);
      }
    }
    catal_local = (xmlCatalogPtr)sgml;
  }
  return (xmlChar *)catal_local;
}

Assistant:

xmlChar *
xmlACatalogResolveURI(xmlCatalogPtr catal, const xmlChar *URI) {
    xmlChar *ret = NULL;

    if ((URI == NULL) || (catal == NULL))
	return(NULL);

    if (xmlDebugCatalogs)
	xmlCatalogPrintDebug(
		"Resolve URI %s\n", URI);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	ret = xmlCatalogListXMLResolveURI(catal->xml, URI);
	if (ret == XML_CATAL_BREAK)
	    ret = NULL;
    } else {
	const xmlChar *sgml;

	sgml = xmlCatalogSGMLResolve(catal, NULL, URI);
	if (sgml != NULL)
            ret = xmlStrdup(sgml);
    }
    return(ret);
}